

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzdecomp.cpp
# Opt level: O2

uint32 lzham::lzham_lib_decompress_deinit(lzham_decompress_state_ptr p)

{
  uint32 uVar1;
  
  if (p == (lzham_decompress_state_ptr)0x0) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(uint32 *)((long)p + 0x548);
    lzham_delete_array<unsigned_char>(*(uchar **)((long)p + 0x538));
    lzham_delete<lzham::lzham_decompressor>((lzham_decompressor *)p);
  }
  return uVar1;
}

Assistant:

uint32 lzham_lib_decompress_deinit(lzham_decompress_state_ptr p)
   {
      lzham_decompressor *pState = static_cast<lzham_decompressor *>(p);
      if (!pState)
         return 0;

      uint32 adler32 = pState->m_decomp_adler32;

      lzham_delete_array(pState->m_pRaw_decomp_buf);
      lzham_delete(pState);

      return adler32;
   }